

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O2

void __thiscall CLI::CallForHelp::~CallForHelp(CallForHelp *this)

{
  Error::~Error((Error *)this);
  operator_delete(this);
  return;
}

Assistant:

CallForHelp() : CallForHelp("This should be caught in your main function, see examples", ExitCodes::Success) {}